

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib573.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  timeval tVar10;
  int running;
  int maxfd;
  double connect_time;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1e0;
  int local_1dc;
  double local_1d8;
  double local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e0 = 1;
  local_1d0 = 0.0;
  local_1d8 = 1.0;
  do {
    local_1d8 = local_1d8 * 0.5;
  } while (1.0 < local_1d8 * 0.5 + 1.0);
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                  ,0x33,iVar1,uVar2);
    goto LAB_0010255e;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar9 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                  ,0x35);
    iVar1 = 0x7c;
    goto LAB_0010253e;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2a,1);
  uVar7 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar7 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar9 = 0;
      uVar6 = 0x38;
      goto LAB_00102531;
    }
    libtest_debug_config.tracetime = 1;
    libtest_debug_config.nohex = 1;
    iVar1 = curl_easy_setopt(lVar3,0x276f);
    uVar7 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar9 = 0;
      uVar6 = 0x3c;
      goto LAB_00102531;
    }
    iVar1 = curl_easy_setopt(lVar3,0x4e7e,libtest_debug_cb);
    uVar7 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar9 = 0;
      uVar6 = 0x3d;
      goto LAB_00102531;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar7 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar9 = 0;
      uVar6 = 0x3e;
      goto LAB_00102531;
    }
    lVar9 = curl_multi_init();
    if (lVar9 == 0) {
      lVar9 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                    ,0x40);
      iVar1 = 0x7b;
    }
    else {
      iVar1 = curl_multi_add_handle(lVar9,lVar3);
      uVar7 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uVar6 = 0x42;
        goto LAB_00102531;
      }
      do {
        local_1dc = -99;
        local_1c8.tv_sec = 0;
        local_1c8.tv_usec = 100000;
        iVar1 = curl_multi_perform(lVar9,&local_1e0);
        uVar7 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uVar6 = 0x4c;
          goto LAB_00102531;
        }
        if (local_1e0 < 0) {
          pcVar8 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uVar7 = 0x4c;
LAB_001028ca:
          curl_mfprintf(_stderr,pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                        ,uVar7);
          iVar1 = 0x7a;
          goto LAB_0010253e;
        }
        tVar10 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar10,tv_test_start);
        if (60000 < lVar4) {
          uVar7 = 0x4e;
LAB_0010293d:
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                        ,uVar7);
          iVar1 = 0x7d;
          goto LAB_0010253e;
        }
        if (local_1e0 == 0) break;
        local_1b8.__fds_bits[0xe] = 0;
        local_1b8.__fds_bits[0xf] = 0;
        local_1b8.__fds_bits[0xc] = 0;
        local_1b8.__fds_bits[0xd] = 0;
        local_1b8.__fds_bits[10] = 0;
        local_1b8.__fds_bits[0xb] = 0;
        local_1b8.__fds_bits[8] = 0;
        local_1b8.__fds_bits[9] = 0;
        local_1b8.__fds_bits[6] = 0;
        local_1b8.__fds_bits[7] = 0;
        local_1b8.__fds_bits[4] = 0;
        local_1b8.__fds_bits[5] = 0;
        local_1b8.__fds_bits[2] = 0;
        local_1b8.__fds_bits[3] = 0;
        local_1b8.__fds_bits[0] = 0;
        local_1b8.__fds_bits[1] = 0;
        local_b8.__fds_bits[0] = 0;
        local_b8.__fds_bits[1] = 0;
        local_b8.__fds_bits[2] = 0;
        local_b8.__fds_bits[3] = 0;
        local_b8.__fds_bits[4] = 0;
        local_b8.__fds_bits[5] = 0;
        local_b8.__fds_bits[6] = 0;
        local_b8.__fds_bits[7] = 0;
        local_b8.__fds_bits[8] = 0;
        local_b8.__fds_bits[9] = 0;
        local_b8.__fds_bits[10] = 0;
        local_b8.__fds_bits[0xb] = 0;
        local_b8.__fds_bits[0xc] = 0;
        local_b8.__fds_bits[0xd] = 0;
        local_b8.__fds_bits[0xe] = 0;
        local_b8.__fds_bits[0xf] = 0;
        local_138.__fds_bits[0] = 0;
        local_138.__fds_bits[1] = 0;
        local_138.__fds_bits[2] = 0;
        local_138.__fds_bits[3] = 0;
        local_138.__fds_bits[4] = 0;
        local_138.__fds_bits[5] = 0;
        local_138.__fds_bits[6] = 0;
        local_138.__fds_bits[7] = 0;
        local_138.__fds_bits[8] = 0;
        local_138.__fds_bits[9] = 0;
        local_138.__fds_bits[10] = 0;
        local_138.__fds_bits[0xb] = 0;
        local_138.__fds_bits[0xc] = 0;
        local_138.__fds_bits[0xd] = 0;
        local_138.__fds_bits[0xe] = 0;
        local_138.__fds_bits[0xf] = 0;
        iVar1 = curl_multi_fdset(lVar9,&local_1b8,&local_b8,&local_138,&local_1dc);
        uVar7 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uVar6 = 0x57;
          goto LAB_00102531;
        }
        if (local_1dc < -1) {
          pcVar8 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uVar7 = 0x57;
          goto LAB_001028ca;
        }
        iVar1 = select_wrapper(local_1dc + 1,&local_1b8,&local_b8,&local_138,&local_1c8);
        if (iVar1 == -1) {
          piVar5 = __errno_location();
          uVar7 = _stderr;
          iVar1 = *piVar5;
          pcVar8 = strerror(iVar1);
          curl_mfprintf(uVar7,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                        ,0x5b,iVar1,pcVar8);
          iVar1 = 0x79;
          goto LAB_0010253e;
        }
        tVar10 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar10,tv_test_start);
        if (60000 < lVar4) {
          uVar7 = 0x5d;
          goto LAB_0010293d;
        }
      } while (local_1e0 != 0);
      iVar1 = 0;
      curl_easy_getinfo(lVar3,0x300005,&local_1d0);
      if (local_1d0 < local_1d8) {
        curl_mfprintf(_stderr,"connect time %e is < epsilon %e\n");
        iVar1 = 0x7e;
      }
    }
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar9 = 0;
    uVar6 = 0x37;
LAB_00102531:
    curl_mfprintf(uVar7,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib573.c"
                  ,uVar6,iVar1,uVar2);
  }
LAB_0010253e:
  curl_multi_remove_handle(lVar9,lVar3);
  curl_multi_cleanup(lVar9);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010255e:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running = 1;
  double connect_time = 0.0;
  double dbl_epsilon;

  dbl_epsilon = 1.0;
  do {
    dbl_epsilon /= 2.0;
  } while((double)(1.0 + (dbl_epsilon/2.0)) > (double)1.0);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_URL, URL);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  easy_setopt(c, CURLOPT_DEBUGDATA, &libtest_debug_config);
  easy_setopt(c, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  while(running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

  curl_easy_getinfo(c, CURLINFO_CONNECT_TIME, &connect_time);
  if(connect_time < dbl_epsilon) {
    fprintf(stderr, "connect time %e is < epsilon %e\n",
            connect_time, dbl_epsilon);
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}